

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit(BinBinaryReader *this,Map *value)

{
  Type *pTVar1;
  uint *puVar2;
  BinCompat *pBVar3;
  uint *puVar4;
  iterator __position;
  uint uVar5;
  char cVar6;
  bool bVar7;
  Category CVar8;
  char *pcVar9;
  long lVar10;
  uint *puVar11;
  pointer pPVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  
  puVar11 = (uint *)(this->reader).cur_;
  if ((char *)((long)puVar11 + 1U) <= (this->reader).cap_) {
    uVar5 = *puVar11;
    (this->reader).cur_ = (char *)((long)puVar11 + 1U);
    pBVar3 = (this->reader).compat_;
    cVar6 = (**(code **)(*(long *)pBVar3 + 0x10))(pBVar3,(char)uVar5,value);
    if (cVar6 != '\0') {
      puVar11 = (uint *)(this->reader).cur_;
      if ((char)value->keyType < '\0') {
        pcVar13 = "ValueHelper::is_primitive(value.keyType)";
      }
      else {
        if ((char *)((long)puVar11 + 1U) <= (this->reader).cap_) {
          pTVar1 = &value->valueType;
          uVar5 = *puVar11;
          (this->reader).cur_ = (char *)((long)puVar11 + 1U);
          pBVar3 = (this->reader).compat_;
          cVar6 = (**(code **)(*(long *)pBVar3 + 0x10))(pBVar3,(char)uVar5,pTVar1);
          if (cVar6 != '\0') {
            puVar11 = (uint *)(this->reader).cur_;
            CVar8 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
                    ::type_to_category(*pTVar1);
            if (CVar8 - OPTION < 3) {
              pcVar13 = "!ValueHelper::is_container(value.valueType)";
            }
            else {
              puVar11 = (uint *)(this->reader).cur_;
              puVar4 = (uint *)(this->reader).cap_;
              puVar2 = puVar11 + 1;
              if (puVar4 < puVar2) {
                pcVar13 = "reader.read(size)";
              }
              else {
                uVar5 = *puVar11;
                (this->reader).cur_ = (char *)puVar2;
                puVar11 = puVar11 + 2;
                if (puVar11 <= puVar4) {
                  pcVar13 = (this->reader).beg_;
                  uVar14 = (ulong)*puVar2;
                  (this->reader).cur_ = (char *)puVar11;
                  pcVar9 = pcVar13;
                  if (uVar14 != 0) {
                    do {
                      __position._M_current =
                           (value->items).
                           super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                      if (__position._M_current ==
                          (value->items).
                          super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::
                        _M_realloc_insert<>(&value->items,__position);
                        pPVar12 = (value->items).
                                  super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>.
                                  _M_impl.super__Vector_impl_data._M_finish;
                      }
                      else {
                        memset(__position._M_current,0,0x90);
                        pPVar12 = (value->items).
                                  super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>.
                                  _M_impl.super__Vector_impl_data._M_finish + 1;
                        (value->items).
                        super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
                        super__Vector_impl_data._M_finish = pPVar12;
                      }
                      puVar11 = (uint *)(this->reader).cur_;
                      bVar7 = read_value_of(this,&pPVar12[-1].key,value->keyType);
                      if (!bVar7) {
                        pcVar13 = "read_value_of(key, value.keyType)";
                        goto LAB_00113061;
                      }
                      puVar11 = (uint *)(this->reader).cur_;
                      bVar7 = read_value_of(this,&pPVar12[-1].value,*pTVar1);
                      if (!bVar7) {
                        pcVar13 = "read_value_of(item, value.valueType)";
                        goto LAB_00113061;
                      }
                      uVar14 = uVar14 - 1;
                    } while (uVar14 != 0);
                    puVar11 = (uint *)(this->reader).cur_;
                    pcVar9 = (this->reader).beg_;
                  }
                  lVar15 = (long)puVar11 - (long)pcVar9;
                  lVar10 = (long)puVar2 + ((ulong)uVar5 - (long)pcVar13);
                  if (lVar15 != lVar10) {
                    bVar7 = fail_msg(this,"reader.position() == position + size",(char *)puVar11);
                    pcVar9 = (char *)(ulong)bVar7;
                  }
                  return (bool)(lVar15 == lVar10 | (byte)pcVar9 & 1);
                }
                pcVar13 = "reader.read(count)";
                puVar11 = puVar2;
              }
            }
            goto LAB_00113061;
          }
        }
        pcVar13 = "reader.read(value.valueType)";
      }
      goto LAB_00113061;
    }
  }
  pcVar13 = "reader.read(value.keyType)";
LAB_00113061:
  bVar7 = fail_msg(this,pcVar13,(char *)puVar11);
  return bVar7;
}

Assistant:

bool read_value_visit(Map& value) noexcept {
            uint32_t size = 0;
            uint32_t count = 0;
            bin_assert(reader.read(value.keyType));
            bin_assert(ValueHelper::is_primitive(value.keyType));
            bin_assert(reader.read(value.valueType));
            bin_assert(!ValueHelper::is_container(value.valueType));
            bin_assert(reader.read(size));
            size_t position = reader.position();
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [key, item] = value.items.emplace_back();
                bin_assert(read_value_of(key, value.keyType));
                bin_assert(read_value_of(item, value.valueType));
            }
            bin_assert(reader.position() == position + size);
            return true;
        }